

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::ProcessControlField(HdlcAnalyzer *this)

{
  HdlcControlType HVar1;
  HdlcFrameType HVar2;
  element_type *peVar3;
  U8 mType;
  undefined1 local_100 [8];
  Frame frame_1;
  undefined1 auStack_d0 [3];
  U8 flag_2;
  HdlcByte byte;
  U32 i;
  U32 ctlBytes;
  Frame frame0;
  undefined1 auStack_80 [3];
  U8 flag_1;
  HdlcFrameType frameType_1;
  HdlcByte byte0;
  HdlcFrameType frameType;
  undefined1 local_58 [8];
  Frame frame;
  undefined1 auStack_28 [7];
  U8 flag;
  HdlcByte controlByte;
  HdlcAnalyzer *this_local;
  
  if ((this->mAbortFrame & 1U) == 0) {
    controlByte._16_8_ = this;
    peVar3 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
    mType = (U8)this;
    if (peVar3->mHdlcControl == HDLC_BASIC_CONTROL_FIELD) {
      ReadByte((HdlcByte *)auStack_28,this);
      if ((this->mAbortFrame & 1U) == 0) {
        CreateFrame((HdlcAnalyzer *)local_58,mType,3,(U64)_auStack_28,controlByte.startSample,
                    (ulong)(byte)controlByte.endSample,'\0');
        AddFrameToResults(this,(Frame *)local_58);
        byte0._16_4_ = GetFrameType((byte)controlByte.endSample);
        this->mCurrentFrameIsSFrame = byte0._16_4_ == HDLC_S_FRAME;
        Frame::~Frame((Frame *)local_58);
      }
    }
    else {
      ReadByte((HdlcByte *)auStack_80,this);
      if ((this->mAbortFrame & 1U) == 0) {
        HVar2 = GetFrameType((byte)byte0.endSample);
        CreateFrame((HdlcAnalyzer *)&i,mType,4,_auStack_80,byte0.startSample,
                    (ulong)(byte)byte0.endSample,'\0');
        AddFrameToResults(this,(Frame *)&i);
        this->mCurrentFrameIsSFrame = HVar2 == HDLC_S_FRAME;
        if (HVar2 != HDLC_U_FRAME) {
          byte._20_4_ = 0;
          peVar3 = std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
          HVar1 = peVar3->mHdlcControl;
          if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_128) {
            byte._20_4_ = 2;
          }
          else if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_32768) {
            byte._20_4_ = 4;
          }
          else if (HVar1 == HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648) {
            byte._20_4_ = 8;
          }
          byte.value = '\x01';
          byte.escaped = false;
          byte._18_2_ = 0;
          while (((uint)byte._16_4_ < (uint)byte._20_4_ &&
                 (ReadByte((HdlcByte *)auStack_d0,this), (this->mAbortFrame & 1U) == 0))) {
            CreateFrame((HdlcAnalyzer *)local_100,mType,4,_auStack_d0,byte.startSample,
                        (ulong)(byte)byte.endSample,byte.value);
            AddFrameToResults(this,(Frame *)local_100);
            Frame::~Frame((Frame *)local_100);
            byte._16_4_ = byte._16_4_ + 1;
          }
        }
        Frame::~Frame((Frame *)&i);
      }
    }
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessControlField()
{
    if( mAbortFrame )
    {
        return;
    }

    if( mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) // Basic Control Field of 1 byte
    {
        HdlcByte controlByte = ReadByte();
        if( mAbortFrame )
        {
            return;
        }

        U8 flag = ( controlByte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
        Frame frame = CreateFrame( HDLC_FIELD_BASIC_CONTROL, controlByte.startSample, controlByte.endSample, controlByte.value, 0, flag );
        AddFrameToResults( frame );

        HdlcFrameType frameType = GetFrameType( controlByte.value );
        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );
    }
    else // Extended Control Field
    {
        // Read first byte and check type of frame
        HdlcByte byte0 = ReadByte();
        if( mAbortFrame )
        {
            return;
        }
        HdlcFrameType frameType = GetFrameType( byte0.value );
        U8 flag = ( byte0.escaped ) ? HDLC_ESCAPED_BYTE : 0;

        Frame frame0 = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte0.startSample, byte0.endSample, byte0.value, 0, flag );
        AddFrameToResults( frame0 );

        mCurrentFrameIsSFrame = ( frameType == HDLC_S_FRAME );

        if( frameType != HDLC_U_FRAME )
        {
            U32 ctlBytes = 0;
            switch( mSettings->mHdlcControl )
            {
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
                ctlBytes = 2;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
                ctlBytes = 4;
                break;
            case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
                ctlBytes = 8;
                break;
            }
            for( U32 i = 1; i < ctlBytes; ++i )
            {
                HdlcByte byte = ReadByte();
                if( mAbortFrame )
                {
                    return;
                }
                U8 flag = ( byte.escaped ) ? HDLC_ESCAPED_BYTE : 0;
                Frame frame = CreateFrame( HDLC_FIELD_EXTENDED_CONTROL, byte.startSample, byte.endSample, byte.value, i, flag );
                AddFrameToResults( frame );
            }
        }
    }
}